

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *args_1,unsigned_long *args_2)

{
  PhysicalOperator *pPVar1;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *this_00;
  long in_RDI;
  PhysicalProjection *ptr;
  data_ptr_t mem;
  PhysicalProjection *in_stack_ffffffffffffff58;
  ArenaAllocator *in_stack_ffffffffffffff60;
  idx_t in_stack_ffffffffffffff98;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_ffffffffffffffa0;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffa8;
  PhysicalProjection *in_stack_ffffffffffffffb0;
  
  pPVar1 = (PhysicalOperator *)
           ArenaAllocator::AllocateAligned
                     (in_stack_ffffffffffffff60,(idx_t)in_stack_ffffffffffffff58);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff60,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff58);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_ffffffffffffff60,
           (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_ffffffffffffff58);
  PhysicalProjection::PhysicalProjection
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)0x76b1ac);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x76b1b6);
  this_00 = (vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             *)(in_RDI + 0x48);
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalProjection&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)this_00,in_stack_ffffffffffffff58);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(this_00,(value_type *)in_stack_ffffffffffffff58);
  return pPVar1;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}